

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

PtrTokenOrSyntax * __thiscall
slang::syntax::BinaryBinsSelectExprSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,BinaryBinsSelectExprSyntax *this,size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  if (this == (BinaryBinsSelectExprSyntax *)0x2) {
    pPVar1 = *(PtrTokenOrSyntax **)
              &__return_storage_ptr__[3].
               super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
  }
  else {
    if (this == (BinaryBinsSelectExprSyntax *)0x1) {
      return __return_storage_ptr__ + 2;
    }
    if (this != (BinaryBinsSelectExprSyntax *)0x0) {
      return (PtrTokenOrSyntax *)0x0;
    }
    pPVar1 = *(PtrTokenOrSyntax **)
              ((long)&__return_storage_ptr__[1].
                      super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
              + 8);
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax BinaryBinsSelectExprSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return left.get();
        case 1: return &op;
        case 2: return right.get();
        default: return nullptr;
    }
}